

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nsc_get_cb(lws_cache_nscookiejar_t *cache,void *opaque,int flags,char *buf,size_t size)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  size_t len;
  uint8_t *p;
  uint8_t *q;
  char tag [200];
  nsc_get_ctx *ctx;
  size_t size_local;
  char *buf_local;
  int flags_local;
  void *opaque_local;
  lws_cache_nscookiejar_t *cache_local;
  
  tag._192_8_ = opaque;
  if (*opaque == 0) {
    if ((flags & 1U) == 0) {
      return 0;
    }
    iVar4 = nsc_line_to_tag(buf,size,(char *)&q,200,(lws_usec_t *)((long)opaque + 0x28));
    if (iVar4 != 0) {
      _lws_log(1,"%s: can\'t get tag\n","nsc_get_cb");
      return 0;
    }
    _lws_log(0x10,"%s: %s %s\n","nsc_get_cb",*(undefined8 *)(tag._192_8_ + 8),&q);
    iVar4 = strcmp(*(char **)(tag._192_8_ + 8),(char *)&q);
    if (iVar4 != 0) {
      _lws_log(0x10,"%s: no match\n","nsc_get_cb");
      return 0;
    }
    _lws_log(0x10,"%s: IS match\n","nsc_get_cb");
    if ((flags & 2U) != 0) {
      **(size_t **)(tag._192_8_ + 0x18) = size;
      iVar4 = (**(code **)(*(long *)(*(long *)(tag._192_8_ + 0x20) + 0x20) + 0x18))
                        (*(undefined8 *)(tag._192_8_ + 0x20),*(undefined8 *)(tag._192_8_ + 8),buf,
                         size,*(undefined8 *)(tag._192_8_ + 0x28),
                         *(undefined8 *)(tag._192_8_ + 0x10));
      if (iVar4 != 0) {
        return -1;
      }
      return 1;
    }
  }
  iVar4 = lws_buflist_append_segment((lws_buflist **)tag._192_8_,(uint8_t *)buf,size);
  if (iVar4 == 0) {
    if ((flags & 2U) == 0) {
      return 0;
    }
    **(size_t **)(tag._192_8_ + 0x18) = size;
    pcVar1 = *(code **)(*(long *)(*(long *)(tag._192_8_ + 0x20) + 0x20) + 0x18);
    uVar2 = *(undefined8 *)(tag._192_8_ + 0x20);
    uVar3 = *(undefined8 *)(tag._192_8_ + 8);
    sVar5 = lws_buflist_total_len((lws_buflist **)tag._192_8_);
    iVar4 = (*pcVar1)(uVar2,uVar3,0,sVar5,*(undefined8 *)(tag._192_8_ + 0x28),&p);
    if (iVar4 == 0) {
      **(undefined8 **)(tag._192_8_ + 0x10) = p;
      do {
        sVar5 = lws_buflist_next_segment_len((lws_buflist **)tag._192_8_,(uint8_t **)&len);
        memcpy(p,(void *)len,sVar5);
        p = p + sVar5;
        lws_buflist_use_segment((lws_buflist **)tag._192_8_,sVar5);
      } while (*(long *)tag._192_8_ != 0);
      return 1;
    }
  }
  lws_buflist_destroy_all_segments((lws_buflist **)tag._192_8_);
  return -1;
}

Assistant:

static int
nsc_get_cb(lws_cache_nscookiejar_t *cache, void *opaque, int flags,
	   const char *buf, size_t size)
{
	struct nsc_get_ctx *ctx = (struct nsc_get_ctx *)opaque;
	char tag[200];
	uint8_t *q;

	if (ctx->buflist)
		goto collect;

	if (!(flags & LCN_SOL))
		return NIR_CONTINUE;

	if (nsc_line_to_tag(buf, size, tag, sizeof(tag), &ctx->expiry)) {
		lwsl_err("%s: can't get tag\n", __func__);
		return NIR_CONTINUE;
	}

	lwsl_cache("%s: %s %s\n", __func__, ctx->specific_key, tag);

	if (strcmp(ctx->specific_key, tag)) {
		lwsl_cache("%s: no match\n", __func__);
		return NIR_CONTINUE;
	}

	/* it's a match */

	lwsl_cache("%s: IS match\n", __func__);

	if (!(flags & LCN_EOL))
		goto collect;

	/* it all fit in the buffer, let's create it in L1 now */

	*ctx->psize = size;
	if (ctx->l1->info.ops->write(ctx->l1,
				     ctx->specific_key, (const uint8_t *)buf,
				     size, ctx->expiry, (void **)ctx->pdata))
		return NIR_FINISH_ERROR;

	return NIR_FINISH_OK;

collect:
	/*
	 * it's bigger than one buffer-load, we have to stash what we're getting
	 * on a buflist and create it when we have it all
	 */

	if (lws_buflist_append_segment(&ctx->buflist, (const uint8_t *)buf,
				       size))
		goto cleanup;

	if (!(flags & LCN_EOL))
		return NIR_CONTINUE;

	/* we have all the payload, create the L1 entry without payload yet */

	*ctx->psize = size;
	if (ctx->l1->info.ops->write(ctx->l1, ctx->specific_key, NULL,
				     lws_buflist_total_len(&ctx->buflist),
				     ctx->expiry, (void **)&q))
		goto cleanup;
	*ctx->pdata = q;

	/* dump the buflist into the L1 cache entry */

	do {
		uint8_t *p;
		size_t len = lws_buflist_next_segment_len(&ctx->buflist, &p);

		memcpy(q, p, len);
		q += len;

		lws_buflist_use_segment(&ctx->buflist, len);
	} while (ctx->buflist);

	return NIR_FINISH_OK;

cleanup:
	lws_buflist_destroy_all_segments(&ctx->buflist);

	return NIR_FINISH_ERROR;
}